

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O0

size_t __thiscall
SGParser::Generator::GrammarOutputC::CreateNonterminalEnum
          (GrammarOutputC *this,String *str,String *name,String *prefix)

{
  size_t size;
  vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  nonterminalVec;
  String dest;
  String *prefix_local;
  String *name_local;
  String *str_local;
  GrammarOutputC *this_local;
  
  if ((this->super_GrammarOutput).pGrammar == (Grammar *)0x0) {
    this_local = (GrammarOutputC *)0x0;
  }
  else {
    std::__cxx11::string::string
              ((string *)
               &nonterminalVec.
                super__Vector_base<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ::vector((vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
              *)&size);
    this_local = (GrammarOutputC *)
                 Grammar::CreateNonterminalVector
                           ((this->super_GrammarOutput).pGrammar,
                            (vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                             *)&size);
    createEnum<SGParser::Generator::GrammarOutputC::CreateNonterminalEnum(std::__cxx11::string&,std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
              (this,(String *)
                    &nonterminalVec.
                     super__Vector_base<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,name,prefix,
               (size_t)this_local,
               (vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                *)&size);
    std::__cxx11::string::swap((string *)str);
    std::
    vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ::~vector((vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
               *)&size);
    std::__cxx11::string::~string
              ((string *)
               &nonterminalVec.
                super__Vector_base<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return (size_t)this_local;
}

Assistant:

size_t GrammarOutputC::CreateNonterminalEnum(String& str, const String& name,
                                             const String& prefix) const {
    if (!pGrammar)
        return 0u;

    String dest;

    std::vector<const String*> nonterminalVec;
    const auto size = pGrammar->CreateNonterminalVector(nonterminalVec);

    // Generate strings
    createEnum(dest, name, prefix, size,
               [&](size_t index) {
                   const auto& valueName = *nonterminalVec[index];
                   // Check why this special case exists
                   return valueName == "[Accept1]" ? String{"Accept1"} : valueName;
               });

    str.swap(dest);

    return size;
}